

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::TracingServiceImpl::WriteIntoFile
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  uint uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  bool bVar4;
  reference this_00;
  size_type sVar5;
  ulong uVar6;
  iovec *__p;
  type piVar7;
  Slices *pSVar8;
  unsigned_long *puVar9;
  char *fname;
  uint *puVar10;
  int *piVar11;
  char *pcVar12;
  ulong local_180;
  ulong local_170;
  anon_class_32_4_24036504 local_168;
  ssize_t local_148;
  ssize_t wr_size;
  int local_134;
  ulong uStack_130;
  int iov_batch_size;
  size_t i;
  size_t kIOVMax;
  uint64_t total_wr_size;
  void *pvStack_110;
  int fd;
  size_t local_108;
  void *local_100;
  char *start;
  Slice *slice;
  const_iterator __end2;
  const_iterator __begin2;
  Slices *__range2;
  reference local_a8;
  TracePacket *packet_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *__range1_1;
  uint64_t bytes_about_to_be_written;
  size_t num_iovecs_at_last_packet;
  unique_ptr<iovec[],_std::default_delete<iovec[]>_> iovecs;
  size_t sStack_68;
  bool stop_writing_into_file;
  size_t num_iovecs;
  size_t max_iovecs;
  TracePacket *packet;
  iterator __end1;
  iterator __begin1;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *__range1;
  size_t total_slices;
  uint64_t max_size;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets_local;
  TracingSession *tracing_session_local;
  TracingServiceImpl *this_local;
  
  bVar4 = perfetto::base::ScopedResource::operator_cast_to_bool
                    ((ScopedResource *)&tracing_session->write_into_file);
  if (bVar4) {
    if (tracing_session->max_file_size_bytes == 0) {
      local_180 = std::numeric_limits<unsigned_long>::max();
    }
    else {
      local_180 = tracing_session->max_file_size_bytes;
    }
    __range1 = (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)0x0;
    __end1 = std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::begin
                       (packets);
    packet = (TracePacket *)
             std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::end
                       (packets);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<perfetto::TracePacket_*,_std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>_>
                                       *)&packet), bVar4) {
      this_00 = __gnu_cxx::
                __normal_iterator<perfetto::TracePacket_*,_std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>_>
                ::operator*(&__end1);
      pSVar8 = TracePacket::slices(this_00);
      sVar5 = std::vector<perfetto::Slice,_std::allocator<perfetto::Slice>_>::size(pSVar8);
      __range1 = (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
                 ((long)&(__range1->
                         super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>
                         )._M_impl.super__Vector_impl_data._M_start + sVar5);
      __gnu_cxx::
      __normal_iterator<perfetto::TracePacket_*,_std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>_>
      ::operator++(&__end1);
    }
    sVar5 = std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::size
                      (packets);
    sStack_68 = 0;
    iovecs._M_t.super___uniq_ptr_impl<iovec,_std::default_delete<iovec[]>_>._M_t.
    super__Tuple_impl<0UL,_iovec_*,_std::default_delete<iovec[]>_>.
    super__Head_base<0UL,_iovec_*,_false>._M_head_impl._7_1_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)&(__range1->
                          super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>
                          )._M_impl.super__Vector_impl_data._M_start + sVar5;
    uVar6 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    __p = (iovec *)operator_new__(uVar6);
    ::std::unique_ptr<iovec[],std::default_delete<iovec[]>>::
    unique_ptr<iovec*,std::default_delete<iovec[]>,void,bool>
              ((unique_ptr<iovec[],std::default_delete<iovec[]>> *)&num_iovecs_at_last_packet,__p);
    __range1_1 = (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)0x0;
    __end1_1 = std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::begin
                         (packets);
    packet_1 = (TracePacket *)
               std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::end
                         (packets);
    while (sVar3 = sStack_68,
          bVar4 = __gnu_cxx::operator!=
                            (&__end1_1,
                             (__normal_iterator<perfetto::TracePacket_*,_std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>_>
                              *)&packet_1), bVar4) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<perfetto::TracePacket_*,_std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>_>
                 ::operator*(&__end1_1);
      TracePacket::GetProtoPreamble((TracePacket *)&stack0xffffffffffffff48);
      piVar7 = std::unique_ptr<iovec[],_std::default_delete<iovec[]>_>::operator[]
                         ((unique_ptr<iovec[],_std::default_delete<iovec[]>_> *)
                          &num_iovecs_at_last_packet,sStack_68);
      std::unique_ptr<iovec[],_std::default_delete<iovec[]>_>::operator[]
                ((unique_ptr<iovec[],_std::default_delete<iovec[]>_> *)&num_iovecs_at_last_packet,
                 sStack_68);
      ::std::tie<void*,unsigned_long>((void **)&__range2,(unsigned_long *)piVar7);
      ::std::tuple<void*&,unsigned_long&>::operator=
                ((tuple<void*&,unsigned_long&> *)&__range2,
                 (tuple<char_*,_unsigned_long> *)&stack0xffffffffffffff48);
      piVar7 = std::unique_ptr<iovec[],_std::default_delete<iovec[]>_>::operator[]
                         ((unique_ptr<iovec[],_std::default_delete<iovec[]>_> *)
                          &num_iovecs_at_last_packet,sStack_68);
      __range1_1 = (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
                   ((long)&(__range1_1->
                           super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>
                           )._M_impl.super__Vector_impl_data._M_start + piVar7->iov_len);
      pSVar8 = TracePacket::slices(local_a8);
      __end2 = std::vector<perfetto::Slice,_std::allocator<perfetto::Slice>_>::begin(pSVar8);
      slice = (Slice *)std::vector<perfetto::Slice,_std::allocator<perfetto::Slice>_>::end(pSVar8);
      while( true ) {
        sStack_68 = sStack_68 + 1;
        bVar4 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_perfetto::Slice_*,_std::vector<perfetto::Slice,_std::allocator<perfetto::Slice>_>_>
                                    *)&slice);
        if (!bVar4) break;
        start = (char *)__gnu_cxx::
                        __normal_iterator<const_perfetto::Slice_*,_std::vector<perfetto::Slice,_std::allocator<perfetto::Slice>_>_>
                        ::operator*(&__end2);
        pvStack_110 = ((reference)start)->start;
        __range1_1 = (vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)
                     ((long)&(__range1_1->
                             super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>
                             )._M_impl.super__Vector_impl_data._M_start + ((reference)start)->size);
        local_108 = ((reference)start)->size;
        local_100 = pvStack_110;
        piVar7 = std::unique_ptr<iovec[],_std::default_delete<iovec[]>_>::operator[]
                           ((unique_ptr<iovec[],_std::default_delete<iovec[]>_> *)
                            &num_iovecs_at_last_packet,sStack_68);
        piVar7->iov_base = pvStack_110;
        piVar7->iov_len = local_108;
        __gnu_cxx::
        __normal_iterator<const_perfetto::Slice_*,_std::vector<perfetto::Slice,_std::allocator<perfetto::Slice>_>_>
        ::operator++(&__end2);
      }
      if (local_180 <=
          (long)&(__range1_1->
                 super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>).
                 _M_impl.super__Vector_impl_data._M_start + tracing_session->bytes_written_into_file
         ) {
        iovecs._M_t.super___uniq_ptr_impl<iovec,_std::default_delete<iovec[]>_>._M_t.
        super__Tuple_impl<0UL,_iovec_*,_std::default_delete<iovec[]>_>.
        super__Head_base<0UL,_iovec_*,_false>._M_head_impl._7_1_ = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<perfetto::TracePacket_*,_std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>_>
      ::operator++(&__end1_1);
    }
    total_wr_size._4_4_ =
         perfetto::base::
         ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
         ::operator*(&tracing_session->write_into_file);
    kIOVMax = 0;
    i = 0x400;
    for (uStack_130 = 0; uStack_130 < sVar3; uStack_130 = uStack_130 + 0x400) {
      wr_size = sVar3 - uStack_130;
      puVar9 = ::std::min<unsigned_long>((unsigned_long *)&wr_size,&i);
      local_134 = (int)*puVar9;
      local_168.fd = (int *)((long)&total_wr_size + 4);
      local_168.iovecs =
           (unique_ptr<iovec[],_std::default_delete<iovec[]>_> *)&num_iovecs_at_last_packet;
      local_168.i = &stack0xfffffffffffffed0;
      local_168.iov_batch_size = &local_134;
      local_148 = WriteIntoFile::anon_class_32_4_24036504::operator()(&local_168);
      if (local_148 < 1) {
        fname = perfetto::base::Basename
                          (
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
        puVar10 = (uint *)__errno_location();
        uVar1 = *puVar10;
        piVar11 = __errno_location();
        pcVar12 = strerror(*piVar11);
        perfetto::base::LogMessage
                  (kLogError,fname,0xe439,"writev() failed (errno: %d, %s)",(ulong)uVar1,pcVar12);
        iovecs._M_t.super___uniq_ptr_impl<iovec,_std::default_delete<iovec[]>_>._M_t.
        super__Tuple_impl<0UL,_iovec_*,_std::default_delete<iovec[]>_>.
        super__Head_base<0UL,_iovec_*,_false>._M_head_impl._7_1_ = 1;
        break;
      }
      kIOVMax = local_148 + kIOVMax;
    }
    tracing_session->bytes_written_into_file = tracing_session->bytes_written_into_file + kIOVMax;
    local_170 = kIOVMax + 0x3ff >> 10;
    perfetto::base::ignore_result<char[46],unsigned_long,bool>
              ((char (*) [46])"Draining into file, written: %lu KB, stop: %d",&local_170,
               (bool *)((long)&iovecs._M_t.
                               super___uniq_ptr_impl<iovec,_std::default_delete<iovec[]>_>._M_t.
                               super__Tuple_impl<0UL,_iovec_*,_std::default_delete<iovec[]>_>.
                               super__Head_base<0UL,_iovec_*,_false>._M_head_impl + 7));
    this_local._7_1_ =
         (bool)(iovecs._M_t.super___uniq_ptr_impl<iovec,_std::default_delete<iovec[]>_>._M_t.
                super__Tuple_impl<0UL,_iovec_*,_std::default_delete<iovec[]>_>.
                super__Head_base<0UL,_iovec_*,_false>._M_head_impl._7_1_ & 1);
    std::unique_ptr<iovec[],_std::default_delete<iovec[]>_>::~unique_ptr
              ((unique_ptr<iovec[],_std::default_delete<iovec[]>_> *)&num_iovecs_at_last_packet);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TracingServiceImpl::WriteIntoFile(TracingSession* tracing_session,
                                       std::vector<TracePacket> packets) {
  if (!tracing_session->write_into_file) {
    return false;
  }
  const uint64_t max_size = tracing_session->max_file_size_bytes
                                ? tracing_session->max_file_size_bytes
                                : std::numeric_limits<size_t>::max();

  size_t total_slices = 0;
  for (const TracePacket& packet : packets) {
    total_slices += packet.slices().size();
  }
  // When writing into a file, the file should look like a root trace.proto
  // message. Each packet should be prepended with a proto preamble stating
  // its field id (within trace.proto) and size. Hence the addition below.
  const size_t max_iovecs = total_slices + packets.size();

  size_t num_iovecs = 0;
  bool stop_writing_into_file = false;
  std::unique_ptr<struct iovec[]> iovecs(new struct iovec[max_iovecs]);
  size_t num_iovecs_at_last_packet = 0;
  uint64_t bytes_about_to_be_written = 0;
  for (TracePacket& packet : packets) {
    std::tie(iovecs[num_iovecs].iov_base, iovecs[num_iovecs].iov_len) =
        packet.GetProtoPreamble();
    bytes_about_to_be_written += iovecs[num_iovecs].iov_len;
    num_iovecs++;
    for (const Slice& slice : packet.slices()) {
      // writev() doesn't change the passed pointer. However, struct iovec
      // take a non-const ptr because it's the same struct used by readv().
      // Hence the const_cast here.
      char* start = static_cast<char*>(const_cast<void*>(slice.start));
      bytes_about_to_be_written += slice.size;
      iovecs[num_iovecs++] = {start, slice.size};
    }

    if (tracing_session->bytes_written_into_file + bytes_about_to_be_written >=
        max_size) {
      stop_writing_into_file = true;
      num_iovecs = num_iovecs_at_last_packet;
      break;
    }

    num_iovecs_at_last_packet = num_iovecs;
  }
  PERFETTO_DCHECK(num_iovecs <= max_iovecs);
  int fd = *tracing_session->write_into_file;

  uint64_t total_wr_size = 0;

  // writev() can take at most IOV_MAX entries per call. Batch them.
  constexpr size_t kIOVMax = IOV_MAX;
  for (size_t i = 0; i < num_iovecs; i += kIOVMax) {
    int iov_batch_size = static_cast<int>(std::min(num_iovecs - i, kIOVMax));
    ssize_t wr_size = PERFETTO_EINTR(writev(fd, &iovecs[i], iov_batch_size));
    if (wr_size <= 0) {
      PERFETTO_PLOG("writev() failed");
      stop_writing_into_file = true;
      break;
    }
    total_wr_size += static_cast<size_t>(wr_size);
  }

  tracing_session->bytes_written_into_file += total_wr_size;

  PERFETTO_DLOG("Draining into file, written: %" PRIu64 " KB, stop: %d",
                (total_wr_size + 1023) / 1024, stop_writing_into_file);
  return stop_writing_into_file;
}